

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m2v_U_invmult_inplace_p(m2v *LU,int rank,m2v *X_inout,int *placements)

{
  long in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  int pj;
  int j;
  int pi;
  int i;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int alpha;
  int r;
  int iVar1;
  int iVar2;
  int local_24;
  
  for (local_24 = in_ESI + -1; -1 < local_24; local_24 = local_24 + -1) {
    r = local_24;
    iVar2 = local_24;
    if (in_RCX != 0) {
      r = *(int *)(in_RCX + (long)local_24 * 4);
    }
    while (iVar2 = iVar2 + 1, iVar2 < *(int *)(in_RDI + 4)) {
      in_stack_ffffffffffffffc4 = iVar2;
      if (in_RCX != 0) {
        in_stack_ffffffffffffffc4 = *(int *)(in_RCX + (long)iVar2 * 4);
      }
      in_stack_ffffffffffffffb8 = in_RDX;
      alpha = in_stack_ffffffffffffffc4;
      iVar1 = in_stack_ffffffffffffffc4;
      m2v_get_el((m2v *)CONCAT44(iVar2,in_stack_ffffffffffffffc4),r,in_stack_ffffffffffffffc4);
      m2v_multadd_row((m2v *)CONCAT44(iVar2,iVar1),r,alpha,
                      (m2v *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    }
    m2v_mult_row((m2v *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void MV_GEN_N(_U_invmult_inplace_p)(const MV_GEN_TYPE* LU,
				int rank,
				MV_GEN_TYPE* X_inout,
				const int* placements)
{
	/* Apply U^(-1) */
	for (int i = rank - 1; i >= 0; --i) {
		const int pi = (placements ? placements[i] : i);
		for (int j = i + 1; j < LU->n_col; ++j) {
			const int pj = (placements ? placements[j] : j);
			MV_GEN_N(_multadd_row)(X_inout, pj,
			  MV_GEN_N(_get_el)(LU, i, j),
			  X_inout, pi);
		}
		MV_GEN_N(_mult_row)(X_inout, pi,
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}